

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-common.c
# Opt level: O1

void la_format_SEQUENCE_OF_as_json(la_asn1_formatter_params p,la_asn1_formatter_func cb)

{
  asn_TYPE_member_s *paVar1;
  long lVar2;
  la_asn1_formatter_params lVar3;
  la_asn1_formatter_params lVar4;
  long lVar5;
  
  lVar4 = p;
  la_json_array_start(p.vstr,p.label);
  if (0 < *(int *)((long)p.sptr + 8)) {
    paVar1 = (p.td)->elements;
    lVar5 = 0;
    do {
      lVar2 = *(long *)(*p.sptr + lVar5 * 8);
      if (lVar2 != 0) {
        la_json_object_start(p.vstr,(char *)0x0);
        lVar3.td = paVar1->type;
        lVar3.vstr = (la_vstring *)SUB168(lVar4._0_16_,0);
        lVar3.label = (char *)SUB168(lVar4._0_16_,8);
        lVar3.sptr = (void *)lVar2;
        lVar3.indent = p.indent;
        lVar3._36_4_ = p._36_4_;
        (*cb)(lVar3);
        la_json_object_end(p.vstr);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)((long)p.sptr + 8));
  }
  la_json_array_end(p.vstr);
  return;
}

Assistant:

void la_format_SEQUENCE_OF_as_json(la_asn1_formatter_params p, la_asn1_formatter_func cb) {
	la_json_array_start(p.vstr, p.label);
	asn_TYPE_member_t *elm = p.td->elements;
	asn_anonymous_set_ const *list = _A_CSET_FROM_VOID(p.sptr);
	for(int i = 0; i < list->count; i++) {
		void const *memb_ptr = list->array[i];
		if(memb_ptr == NULL) {
			continue;
		}
		la_json_object_start(p.vstr, NULL);
		p.td = elm->type;
		p.sptr = memb_ptr;
		cb(p);
		la_json_object_end(p.vstr);
	}
	la_json_array_end(p.vstr);
}